

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxShellsort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start)

{
  int iVar1;
  IdxElement *pIVar2;
  double dVar3;
  int iVar4;
  double dVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  IdxElement *pIVar13;
  
  for (uVar9 = 2; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
    iVar4 = SPxShellsort<soplex::SPxPricer<double>::IdxElement,_soplex::SPxPricer<double>::IdxCompare>
            ::incs[uVar9];
    iVar12 = start;
    for (lVar11 = (long)(iVar4 + start); lVar11 <= end; lVar11 = lVar11 + 1) {
      iVar7 = keys[lVar11].idx;
      uVar8 = *(undefined4 *)&keys[lVar11].field_0x4;
      dVar3 = keys[lVar11].val;
      iVar10 = iVar12;
      while ((iVar1 = iVar4 + iVar10, iVar4 + start <= iVar1 &&
             (keys[iVar10].val <= dVar3 && dVar3 != keys[iVar10].val))) {
        pIVar13 = keys + iVar10;
        uVar6 = *(undefined4 *)&pIVar13->field_0x4;
        dVar5 = pIVar13->val;
        pIVar2 = keys + iVar1;
        pIVar2->idx = pIVar13->idx;
        *(undefined4 *)&pIVar2->field_0x4 = uVar6;
        pIVar2->val = dVar5;
        iVar10 = iVar10 - iVar4;
      }
      keys[iVar1].idx = iVar7;
      *(undefined4 *)&keys[iVar1].field_0x4 = uVar8;
      keys[iVar1].val = dVar3;
      iVar12 = iVar12 + 1;
    }
  }
  return;
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}